

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O3

LPSTR GetEnvironmentStringsA(void)

{
  char **ppcVar1;
  size_t sVar2;
  LPSTR pCVar3;
  char *pcVar4;
  size_t szSize;
  int iVar5;
  int iVar6;
  LPSTR __dest;
  int iVar7;
  
  if (PAL_InitializeChakraCoreCalled) {
    PALCEnterCriticalSection(&gcsEnvironment);
    ppcVar1 = palEnvironment;
    pcVar4 = *palEnvironment;
    if (pcVar4 == (char *)0x0) {
      szSize = 1;
    }
    else {
      iVar6 = 0;
      iVar7 = 1;
      do {
        sVar2 = strlen(pcVar4);
        iVar5 = iVar6 + (int)sVar2;
        iVar6 = iVar5 + 1;
        pcVar4 = ppcVar1[iVar7];
        iVar7 = iVar7 + 1;
      } while (pcVar4 != (char *)0x0);
      szSize = (size_t)(iVar5 + 2);
    }
    pCVar3 = (LPSTR)PAL_malloc(szSize);
    if (pCVar3 == (LPSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c59ea;
      SetLastError(8);
    }
    else {
      pcVar4 = *palEnvironment;
      __dest = pCVar3;
      if (pcVar4 != (char *)0x0) {
        iVar6 = 1;
        do {
          sVar2 = strlen(pcVar4);
          sVar2 = (size_t)((int)sVar2 + 1);
          memcpy(__dest,pcVar4,sVar2);
          __dest = __dest + sVar2;
          pcVar4 = palEnvironment[iVar6];
          iVar6 = iVar6 + 1;
        } while (pcVar4 != (char *)0x0);
      }
      *__dest = '\0';
    }
    PALCLeaveCriticalSection(&gcsEnvironment);
    if (PAL_InitializeChakraCoreCalled != false) {
      return pCVar3;
    }
  }
LAB_002c59ea:
  abort();
}

Assistant:

LPSTR
PALAPI
GetEnvironmentStringsA(
               VOID)
{
    char *environ = NULL, *tempEnviron;
    int i, len, envNum;

    PERF_ENTRY(GetEnvironmentStringsA);
    ENTRY("GetEnvironmentStringsA()\n");

    PALCEnterCriticalSection(&gcsEnvironment);    

    envNum = 0;
    len    = 0;

    /* get total length of the bytes that we need to allocate */
    for (i = 0; palEnvironment[i] != 0; i++)
    {
        len = strlen(palEnvironment[i]) + 1;
        envNum += len;
    }

    environ = (char *)PAL_malloc(envNum + 1);
    if (environ == NULL)
    {
        ERROR("malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto EXIT;
    }

    len = 0;
    tempEnviron = environ;
    for (i = 0; palEnvironment[i] != 0; i++)
    {
        len = strlen(palEnvironment[i]) + 1;
        memcpy(tempEnviron, palEnvironment[i], len);
        tempEnviron += len;
        envNum      -= len;
    }

    *tempEnviron = 0; /* Put an extra NULL at the end */
    
 EXIT:
    PALCLeaveCriticalSection(&gcsEnvironment);

    LOGEXIT("GetEnvironmentStringsA returning %p\n", environ);
    PERF_EXIT(GetEnvironmentStringsA);
    return environ;
}